

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprParserHelper.cxx
# Opt level: O0

void __thiscall cmExprParserHelper::UnexpectedChar(cmExprParserHelper *this,char c)

{
  ulong uVar1;
  ostream *poVar2;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream ostr;
  unsigned_long pos;
  char c_local;
  cmExprParserHelper *this_local;
  
  uVar1 = this->InputBufferPos;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,"Unexpected character in expression at position ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2,": ");
  poVar2 = std::operator<<(poVar2,c);
  std::operator<<(poVar2,"\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator+=((string *)&this->WarningString,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void cmExprParserHelper::UnexpectedChar(char c)
{
  unsigned long pos = static_cast<unsigned long>(this->InputBufferPos);
  std::ostringstream ostr;
  ostr << "Unexpected character in expression at position " << pos << ": " << c
       << "\n";
  this->WarningString += ostr.str();
}